

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::Identification::Copy(Identification *this,Identification *rhs)

{
  undefined8 uVar1;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  (this->ThisGenerationUID).super_Identifier<16U>.m_HasValue =
       (rhs->ThisGenerationUID).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->ThisGenerationUID).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->ThisGenerationUID).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->ThisGenerationUID).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->ThisGenerationUID).super_Identifier<16U>.m_Value + 8) = uVar1;
  std::__cxx11::string::_M_assign((string *)&(this->CompanyName).super_string);
  std::__cxx11::string::_M_assign((string *)&(this->ProductName).super_string);
  VersionType::Copy(&this->ProductVersion,&rhs->ProductVersion);
  std::__cxx11::string::_M_assign((string *)&(this->VersionString).super_string);
  (this->ProductUID).super_Identifier<16U>.m_HasValue =
       (rhs->ProductUID).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->ProductUID).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->ProductUID).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->ProductUID).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->ProductUID).super_Identifier<16U>.m_Value + 8) = uVar1;
  Kumu::Timestamp::operator=(&this->ModificationDate,&rhs->ModificationDate);
  VersionType::Copy(&this->ToolkitVersion,&rhs->ToolkitVersion);
  optional_property<ASDCP::MXF::UTF16String>::operator=(&this->Platform,&rhs->Platform);
  return;
}

Assistant:

void
Identification::Copy(const Identification& rhs)
{
  InterchangeObject::Copy(rhs);
  ThisGenerationUID = rhs.ThisGenerationUID;
  CompanyName = rhs.CompanyName;
  ProductName = rhs.ProductName;
  ProductVersion = rhs.ProductVersion;
  VersionString = rhs.VersionString;
  ProductUID = rhs.ProductUID;
  ModificationDate = rhs.ModificationDate;
  ToolkitVersion = rhs.ToolkitVersion;
  Platform = rhs.Platform;
}